

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nes_Oscs.cpp
# Opt level: O2

void __thiscall Nes_Envelope::clock_envelope(Nes_Envelope *this)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  
  bVar1 = (this->super_Nes_Osc).regs[0];
  uVar3 = bVar1 & 0xf;
  if ((this->super_Nes_Osc).reg_written[3] == true) {
    (this->super_Nes_Osc).reg_written[3] = false;
    this->env_delay = uVar3;
    this->envelope = 0xf;
    return;
  }
  iVar2 = this->env_delay;
  this->env_delay = iVar2 + -1;
  if (iVar2 < 1) {
    this->env_delay = uVar3;
    if ((bVar1 & 0x20) != 0 || this->envelope != 0) {
      this->envelope = this->envelope - 1U & 0xf;
      return;
    }
  }
  return;
}

Assistant:

void Nes_Envelope::clock_envelope()
{
	int period = regs [0] & 15;
	if ( reg_written [3] ) {
		reg_written [3] = false;
		env_delay = period;
		envelope = 15;
	}
	else if ( --env_delay < 0 ) {
		env_delay = period;
		if ( envelope | (regs [0] & 0x20) )
			envelope = (envelope - 1) & 15;
	}
}